

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

uint32 __thiscall
Clasp::LoopFormula::isOpen(LoopFormula *this,Solver *s,TypeSet *xs,LitVec *freeLits)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  uint32 uVar5;
  long lVar6;
  Literal *x;
  
  uVar5 = 0;
  if (((xs->m & 4) != 0) && (bVar1 = otherIsSat(this,s), uVar5 = 0, !bVar1)) {
    uVar4 = (ulong)(*(uint *)&this->field_0x10 >> 0x1f);
    uVar2 = *(uint *)((long)&this[1].super_Constraint._vptr_Constraint + uVar4 * 4 + 4);
    bVar1 = uVar2 < 4;
    if (!bVar1) {
      lVar6 = uVar4 * 4 + 0x1c;
      do {
        bVar3 = *(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar2 & 0xfffffffc)) & 3;
        if (bVar3 == 0) {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (freeLits,(Literal *)((long)&(this->super_Constraint)._vptr_Constraint + lVar6))
          ;
        }
        else if (bVar3 == (byte)(2U - ((uVar2 & 2) == 0))) {
          this->other_ = (uint32)(lVar6 - 0x18U >> 2);
          if (!bVar1) {
            return 0;
          }
          break;
        }
        uVar2 = *(uint *)((long)&(this->super_Constraint)._vptr_Constraint + lVar6 + 4);
        bVar1 = uVar2 < 4;
        lVar6 = lVar6 + 4;
      } while (3 < uVar2);
    }
    x = (Literal *)((long)&this[1].super_Constraint._vptr_Constraint + (ulong)this->end_ * 4 + 4);
    uVar5 = 2;
    if (x != (Literal *)
             ((long)&this[1].super_Constraint._vptr_Constraint +
             (ulong)(*(uint *)&this->field_0x10 * 4))) {
      lVar6 = (ulong)(*(uint *)&this->field_0x10 & 0x3fffffff) * 4 + (ulong)this->end_ * -4 + -4;
      do {
        if ((*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(x->rep_ & 0xfffffffc)) & 3) ==
            0) {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(freeLits,x)
          ;
        }
        x = x + 1;
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
    }
  }
  return uVar5;
}

Assistant:

uint32 LoopFormula::isOpen(const Solver& s, const TypeSet& xs, LitVec& freeLits) {
	if (!xs.inSet(Constraint_t::Loop) || otherIsSat(s)) {
		return 0;
	}
	for (Literal* it = begin() + xPos_; !isSentinel(*it); ++it) {
		if      (s.value(it->var()) == value_free) { freeLits.push_back(*it); }
		else if (s.isTrue(*it))                    { other_ = static_cast<uint32>(it-lits_); return 0; }
	}
	for (Literal* it = xBegin(), *end = xEnd(); it != end; ++it) {
		if (s.value(it->var()) == value_free) { freeLits.push_back(*it); }
	}
	return Constraint_t::Loop;
}